

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Settings::BoolParam::BoolParam(BoolParam *this)

{
  string *in_RDI;
  string *local_40;
  string *local_20;
  
  local_20 = in_RDI;
  do {
    std::__cxx11::string::string(local_20);
    local_20 = local_20 + 0x20;
  } while (local_20 != in_RDI + 0x340);
  local_40 = in_RDI + 0x340;
  do {
    std::__cxx11::string::string(local_40);
    local_40 = local_40 + 0x20;
  } while (local_40 != in_RDI + 0x680);
  std::__cxx11::string::operator=(in_RDI,"lifting");
  std::__cxx11::string::operator=
            (in_RDI + 0x340,"should lifting be used to reduce range of nonzero matrix coefficients?"
            );
  in_RDI[0x680] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x20,"eqtrans");
  std::__cxx11::string::operator=
            (in_RDI + 0x360,"should LP be transformed to equality form before a rational solve?");
  in_RDI[0x681] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x40,"testdualinf");
  std::__cxx11::string::operator=
            (in_RDI + 0x380,
             "should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?"
            );
  in_RDI[0x682] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x60,"ratfac");
  std::__cxx11::string::operator=
            (in_RDI + 0x3a0,
             "should a rational factorization be performed after iterative refinement?");
  in_RDI[0x683] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x80,"acceptcycling");
  std::__cxx11::string::operator=
            (in_RDI + 0x3c0,"should cycling solutions be accepted during iterative refinement?");
  in_RDI[0x684] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0xa0,"ratrec");
  std::__cxx11::string::operator=
            (in_RDI + 0x3e0,"apply rational reconstruction after each iterative refinement?");
  in_RDI[0x685] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0xc0,"powerscaling");
  std::__cxx11::string::operator=
            (in_RDI + 0x400,"round scaling factors for iterative refinement to powers of two?");
  in_RDI[0x686] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0xe0,"ratfacjump");
  std::__cxx11::string::operator=
            (in_RDI + 0x420,
             "continue iterative refinement with exact basic solution if not optimal?");
  in_RDI[0x687] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x100,"rowboundflips");
  std::__cxx11::string::operator=(in_RDI + 0x440,"use bound flipping also for row representation?");
  in_RDI[0x688] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x120,"persistentscaling");
  std::__cxx11::string::operator=(in_RDI + 0x460,"should persistent scaling be used?");
  in_RDI[0x689] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x140,"fullperturbation");
  std::__cxx11::string::operator=
            (in_RDI + 0x480,"should perturbation be applied to the entire problem?");
  in_RDI[0x68a] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x160,"ensureray");
  std::__cxx11::string::operator=
            (in_RDI + 0x4a0,
             "re-optimize the original problem to get a proof (ray) of infeasibility/unboundedness?"
            );
  in_RDI[0x68b] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x180,"forcebasic");
  std::__cxx11::string::operator=
            (in_RDI + 0x4c0,"try to enforce that the optimal solution is a basic solution");
  in_RDI[0x68c] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x1a0,"simplifier_enable_singletoncols");
  std::__cxx11::string::operator=(in_RDI + 0x4e0,"enable presolver SingletonCols in PaPILO");
  in_RDI[0x68d] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x1c0,"simplifier_enable_propagation");
  std::__cxx11::string::operator=(in_RDI + 0x500,"enable presolver ConstraintPropagation in PaPILO")
  ;
  in_RDI[0x68e] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x1e0,"simplifier_enable_parallelrows");
  std::__cxx11::string::operator=(in_RDI + 0x520,"enable presolver ParallelRowDetection in PaPILO");
  in_RDI[0x68f] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x200,"simplifier_enable_parallelcols");
  std::__cxx11::string::operator=(in_RDI + 0x540,"enable presolver ParallelColDetection in PaPILO");
  in_RDI[0x690] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x220,"simplifier_enable_stuffing");
  std::__cxx11::string::operator=(in_RDI + 0x560,"enable presolver SingletonStuffing in PaPILO");
  in_RDI[0x691] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x240,"simplifier_enable_dualfix");
  std::__cxx11::string::operator=(in_RDI + 0x580,"enable presolver DualFix in PaPILO");
  in_RDI[0x692] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x260,"simplifier_enable_fixcontinuous");
  std::__cxx11::string::operator=(in_RDI + 0x5a0,"enable presolver FixContinuous in PaPILO");
  in_RDI[0x693] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x280,"simplifier_enable_domcol");
  std::__cxx11::string::operator=(in_RDI + 0x5c0,"enable presolver DominatedCols in PaPILO");
  in_RDI[0x694] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x2a0,"iterative_refinement");
  std::__cxx11::string::operator=(in_RDI + 0x5e0,"enable iterative refinement");
  in_RDI[0x695] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 0x2c0,"adapt_tols_to_multiprecision");
  std::__cxx11::string::operator=(in_RDI + 0x600,"adapt tolerances to the multiprecision used");
  in_RDI[0x696] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x2e0,"precision_boosting");
  std::__cxx11::string::operator=(in_RDI + 0x620,"enable precision boosting");
  in_RDI[0x697] = (string)0x0;
  std::__cxx11::string::operator=(in_RDI + 0x300,"boosted_warm_start");
  std::__cxx11::string::operator=
            (in_RDI + 0x640,
             "if true, boosted solver starts from last basis, otherwise from slack basis");
  in_RDI[0x698] = (string)0x1;
  std::__cxx11::string::operator=(in_RDI + 800,"recovery_mechanism");
  std::__cxx11::string::operator=
            (in_RDI + 0x660,"enable recovery mechanism for when the solve fails");
  in_RDI[0x699] = (string)0x0;
  return;
}

Assistant:

SoPlexBase<R>::Settings::BoolParam::BoolParam()
{
   // should lifting be used to reduce range of nonzero matrix coefficients?
   name[SoPlexBase<R>::LIFTING] = "lifting";
   description[SoPlexBase<R>::LIFTING] =
      "should lifting be used to reduce range of nonzero matrix coefficients?";
   defaultValue[SoPlexBase<R>::LIFTING] = false;

   // should LP be transformed to equality form before a rational solve?
   name[SoPlexBase<R>::EQTRANS] = "eqtrans";
   description[SoPlexBase<R>::EQTRANS] =
      "should LP be transformed to equality form before a rational solve?";
   defaultValue[SoPlexBase<R>::EQTRANS] = false;

   // should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?
   name[SoPlexBase<R>::TESTDUALINF] = "testdualinf";
   description[SoPlexBase<R>::TESTDUALINF] =
      "should dual infeasibility be tested in order to try to return a dual solution even if primal infeasible?";
   defaultValue[SoPlexBase<R>::TESTDUALINF] = false;

   // should a rational factorization be performed after iterative refinement?
   name[SoPlexBase<R>::RATFAC] = "ratfac";
   description[SoPlexBase<R>::RATFAC] =
      "should a rational factorization be performed after iterative refinement?";
   defaultValue[SoPlexBase<R>::RATFAC] = true;

   // should cycling solutions be accepted during iterative refinement?
   name[SoPlexBase<R>::ACCEPTCYCLING] = "acceptcycling";
   description[SoPlexBase<R>::ACCEPTCYCLING] =
      "should cycling solutions be accepted during iterative refinement?";
   defaultValue[SoPlexBase<R>::ACCEPTCYCLING] = false;

   // apply rational reconstruction after each iterative refinement?
   name[SoPlexBase<R>::RATREC] = "ratrec";
   description[SoPlexBase<R>::RATREC] =
      "apply rational reconstruction after each iterative refinement?";
   defaultValue[SoPlexBase<R>::RATREC] = true;

   // round scaling factors for iterative refinement to powers of two?
   name[SoPlexBase<R>::POWERSCALING] = "powerscaling";
   description[SoPlexBase<R>::POWERSCALING] =
      "round scaling factors for iterative refinement to powers of two?";
   defaultValue[SoPlexBase<R>::POWERSCALING] = true;

   // continue iterative refinement with exact basic solution if not optimal?
   name[SoPlexBase<R>::RATFACJUMP] = "ratfacjump";
   description[SoPlexBase<R>::RATFACJUMP] =
      "continue iterative refinement with exact basic solution if not optimal?";
   defaultValue[SoPlexBase<R>::RATFACJUMP] = false;

   // use bound flipping also for row representation?
   name[SoPlexBase<R>::ROWBOUNDFLIPS] = "rowboundflips";
   description[SoPlexBase<R>::ROWBOUNDFLIPS] = "use bound flipping also for row representation?";
   defaultValue[SoPlexBase<R>::ROWBOUNDFLIPS] = false;

   // use persistent scaling?
   name[SoPlexBase<R>::PERSISTENTSCALING] = "persistentscaling";
   description[SoPlexBase<R>::PERSISTENTSCALING] = "should persistent scaling be used?";
   defaultValue[SoPlexBase<R>::PERSISTENTSCALING] = true;

   // perturb the entire problem or only the relevant bounds of s single pivot?
   name[SoPlexBase<R>::FULLPERTURBATION] = "fullperturbation";
   description[SoPlexBase<R>::FULLPERTURBATION] =
      "should perturbation be applied to the entire problem?";
   defaultValue[SoPlexBase<R>::FULLPERTURBATION] = false;

   /// re-optimize the original problem to get a proof of infeasibility/unboundedness?
   name[SoPlexBase<R>::ENSURERAY] = "ensureray";
   description[SoPlexBase<R>::ENSURERAY] =
      "re-optimize the original problem to get a proof (ray) of infeasibility/unboundedness?";
   defaultValue[SoPlexBase<R>::ENSURERAY] = false;

   /// try to enforce that the optimal solution is a basic solution
   name[SoPlexBase<Real>::FORCEBASIC] = "forcebasic";
   description[SoPlexBase<Real>::FORCEBASIC] =
      "try to enforce that the optimal solution is a basic solution";
   defaultValue[SoPlexBase<Real>::FORCEBASIC] = false;

   name[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] = "simplifier_enable_singletoncols";
   description[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] =
      "enable presolver SingletonCols in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_SINGLETONCOLS] = true;

   name[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] = "simplifier_enable_propagation";
   description[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] =
      "enable presolver ConstraintPropagation in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_CONSTRAINTPROPAGATION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] = "simplifier_enable_parallelrows";
   description[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] =
      "enable presolver ParallelRowDetection in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_PARALLELROWDETECTION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] = "simplifier_enable_parallelcols";
   description[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] =
      "enable presolver ParallelColDetection in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_PARALLELCOLDETECTION] = true;

   name[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] = "simplifier_enable_stuffing";
   description[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] =
      "enable presolver SingletonStuffing in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_SINGLETONSTUFFING] = true;

   name[SoPlexBase<R>::SIMPLIFIER_DUALFIX] = "simplifier_enable_dualfix";
   description[SoPlexBase<R>::SIMPLIFIER_DUALFIX] =
      "enable presolver DualFix in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_DUALFIX] = true;

   name[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] = "simplifier_enable_fixcontinuous";
   description[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] =
      "enable presolver FixContinuous in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_FIXCONTINUOUS] = true;

   name[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] = "simplifier_enable_domcol";
   description[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] =
      "enable presolver DominatedCols in PaPILO";
   defaultValue[SoPlexBase<R>::SIMPLIFIER_DOMINATEDCOLS] = true;

   name[SoPlexBase<R>::ITERATIVE_REFINEMENT] = "iterative_refinement";
   description[SoPlexBase<R>::ITERATIVE_REFINEMENT] =
      "enable iterative refinement";
   defaultValue[SoPlexBase<R>::ITERATIVE_REFINEMENT] = true;

   // adapt tolerances to the multiprecision used
   name[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] = "adapt_tols_to_multiprecision";
   description[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] =
      "adapt tolerances to the multiprecision used";
   defaultValue[SoPlexBase<R>::ADAPT_TOLS_TO_MULTIPRECISION] = false;

   name[SoPlexBase<R>::PRECISION_BOOSTING] = "precision_boosting";
   description[SoPlexBase<R>::PRECISION_BOOSTING] =
      "enable precision boosting";
#ifdef SOPLEX_WITH_MPFR
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING] = true;
#else
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING] = false;
#endif

   name[SoPlexBase<R>::BOOSTED_WARM_START] = "boosted_warm_start";
   description[SoPlexBase<R>::BOOSTED_WARM_START] =
      "if true, boosted solver starts from last basis, otherwise from slack basis";
   defaultValue[SoPlexBase<R>::BOOSTED_WARM_START] = true;

   name[SoPlexBase<R>::RECOVERY_MECHANISM] = "recovery_mechanism";
   description[SoPlexBase<R>::RECOVERY_MECHANISM] =
      "enable recovery mechanism for when the solve fails";
   defaultValue[SoPlexBase<R>::RECOVERY_MECHANISM] = false;
}